

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O2

Person * __thiscall Person::operator=(Person *this,Person *obj)

{
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->name,&obj->name);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->id,&obj->id);
  Address::operator=(&this->address,&obj->address);
  return this;
}

Assistant:

Person &Person::operator=(const Person &obj) {
    this->name = obj.name;
    this->id = obj.id;
    this->address = obj.address;

    return *this;
}